

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall cmLocalGenerator::AppendFlags(cmLocalGenerator *this,string *flags,string *newFlags)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  bool bVar1;
  
  __first._M_current = (newFlags->_M_dataplus)._M_p;
  bVar1 = std::all_of<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,bool(*)(char)>
                    (__first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )(__first._M_current + newFlags->_M_string_length),cmIsSpace);
  if ((!bVar1) && (newFlags->_M_string_length != 0)) {
    if (flags->_M_string_length != 0) {
      std::__cxx11::string::append((char *)flags);
    }
    std::__cxx11::string::append((string *)flags);
    return;
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendFlags(std::string& flags,
                                   const std::string& newFlags) const
{
  bool allSpaces = std::all_of(newFlags.begin(), newFlags.end(), cmIsSpace);

  if (!newFlags.empty() && !allSpaces) {
    if (!flags.empty()) {
      flags += " ";
    }
    flags += newFlags;
  }
}